

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O2

bool __thiscall axl::io::SockAddrParser::tryAddr_ip4(SockAddrParser *this)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = 4;
  while( true ) {
    bVar1 = tryInt(this,10);
    if (!bVar1) {
      return false;
    }
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) break;
    bVar1 = tryChar(this,'.');
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
SockAddrParser::tryAddr_ip4() {
	bool result;

	for (size_t i = 0;; i++) {
		result = tryInt(10);
		if (!result)
			return false;

		if (i >= 3)
			break;

		result = tryChar('.');
		if (!result)
			return false;
	}

	return true;
}